

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

Layer * __thiscall ncnn::Net::create_custom_layer(Net *this,int index)

{
  pointer pcVar1;
  ulong uVar2;
  Layer *pLVar3;
  
  pLVar3 = (Layer *)0x0;
  if (-1 < index) {
    uVar2 = (ulong)(uint)index;
    pcVar1 = (this->d->custom_layer_registry).
             super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (uVar2 < (ulong)((long)(this->d->custom_layer_registry).
                              super__Vector_base<ncnn::custom_layer_registry_entry,_std::allocator<ncnn::custom_layer_registry_entry>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pcVar1 >> 5)) {
      if (pcVar1[uVar2].creator == (layer_creator_func)0x0) {
        pLVar3 = (Layer *)0x0;
      }
      else {
        pLVar3 = (*pcVar1[uVar2].creator)(pcVar1[uVar2].userdata);
        pLVar3->typeindex = index | 0x100;
      }
    }
  }
  return pLVar3;
}

Assistant:

Layer* Net::create_custom_layer(int index)
{
    const size_t custom_layer_registry_entry_count = d->custom_layer_registry.size();
    if (index < 0 || static_cast<unsigned int>(index) >= custom_layer_registry_entry_count)
        return 0;

    layer_creator_func layer_creator = d->custom_layer_registry[index].creator;
    if (!layer_creator)
        return 0;

    Layer* layer = layer_creator(d->custom_layer_registry[index].userdata);
    layer->typeindex = ncnn::LayerType::CustomBit | index;
    return layer;
}